

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

bool __thiscall TgBot::Api::setChatPhoto(Api *this,int64_t chatId,Ptr *photo)

{
  element_type *__args_1;
  type_conflict tVar1;
  bool local_aa;
  allocator local_a9;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  int64_t chatId_local;
  string local_88;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  ptree local_38;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chatId_local = chatId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,2);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])0x27334a,&chatId_local);
  __args_1 = (photo->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.m_value._M_dataplus._M_p._0_1_ = 1;
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[6],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [6])0x277aff,&__args_1->data,(bool *)&local_68,&__args_1->mimeType,
             &__args_1->fileName);
  std::__cxx11::string::string((string *)&local_88,"setChatPhoto",&local_a9);
  sendRequest(&local_38,this,&local_88,&args);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_68,"",0x2e);
  local_aa = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_38,&local_68,&local_aa);
  std::__cxx11::string::~string((string *)&local_68);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_38);
  std::__cxx11::string::~string((string *)&local_88);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  return tVar1;
}

Assistant:

bool Api::setChatPhoto(int64_t chatId, const InputFile::Ptr photo) const {
    vector<HttpReqArg> args;
    args.reserve(2);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("photo", photo->data, true, photo->mimeType, photo->fileName);
    return sendRequest("setChatPhoto", args).get<bool>("", false);
}